

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_ubjson.hpp
# Opt level: O2

type jsoncons::ubjson::
     encode_ubjson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               ubjson_encode_options *options)

{
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  ubjson_stream_encoder encoder;
  allocator<char> local_d9;
  binary_stream_sink local_d8;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> local_a0;
  
  binary_stream_sink::binary_stream_sink(&local_d8,os);
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_ubjson_encoder
            (&local_a0,&local_d8,options,&local_d9);
  binary_stream_sink::~binary_stream_sink(&local_d8);
  local_d8.stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_json_visitor_009b4bf0;
  local_d8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_a0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (j,(basic_json_visitor<char> *)&local_d8);
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_ubjson_encoder
            (&local_a0);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_ubjson(const T& j, 
                  std::ostream& os, 
                  const ubjson_encode_options& options = ubjson_encode_options())
    {
        using char_type = typename T::char_type;
        ubjson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }